

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f615c::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable
          (OwnershipAnalysis *this)

{
  BuildNode *pBVar1;
  anon_class_16_1_59ec9b75_for__M_pred __pred;
  bool bVar2;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  __result;
  reference ppVar3;
  StringRef local_b8;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  local_a8;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *local_a0;
  BuildNode *local_98;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *local_90;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  local_88;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  local_80;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  repairableUnownedNode;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> outputNodeAndCommand;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  *__range2;
  undefined1 local_28 [8];
  vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  unownedDirectoryInputNodesAndConsumingCommands;
  OwnershipAnalysis *this_local;
  
  unownedDirectoryInputNodesAndConsumingCommands.
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  memset(local_28,0,0x18);
  std::
  vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ::vector((vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
            *)local_28);
  __first = std::
            vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
            ::begin(&this->directoryInputNodesAndCommands);
  __last = std::
           vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
           ::end(&this->directoryInputNodesAndCommands);
  __result = std::
             back_inserter<std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>
                       ((vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                         *)local_28);
  std::
  copy_if<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,std::back_insert_iterator<std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>
            ((__normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
              )__last._M_current,__result,(anon_class_8_1_8991fb9c)this);
  __end2 = std::
           vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
           ::begin(&this->outputNodesAndCommands);
  outputNodeAndCommand.second =
       (Command *)
       std::
       vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
       ::end(&this->outputNodesAndCommands);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
                                     *)&outputNodeAndCommand.second), bVar2) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
             ::operator*(&__end2);
    repairableUnownedNode._M_current =
         (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)ppVar3->first;
    outputNodeAndCommand.first = (BuildNode *)ppVar3->second;
    local_88._M_current =
         (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)
         std::
         vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
         ::begin((vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                  *)local_28);
    local_90 = (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)
               std::
               vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
               ::end((vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                      *)local_28);
    local_a0 = repairableUnownedNode._M_current;
    local_98 = outputNodeAndCommand.first;
    __pred.outputNodeAndCommand.second = (Command *)outputNodeAndCommand.first;
    __pred.outputNodeAndCommand.first = (BuildNode *)repairableUnownedNode._M_current;
    local_80 = std::
               find_if<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,(anonymous_namespace)::OwnershipAnalysis::deferScanningUnownedInputsUntilSubpathsAvailable()::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_2_>
                         (local_88,(__normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
                                    )local_90,__pred);
    local_a8._M_current =
         (pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)
         std::
         vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
         ::end((vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                *)local_28);
    bVar2 = __gnu_cxx::operator!=(&local_80,&local_a8);
    if (bVar2) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
               ::operator*(&local_80);
      pBVar1 = ppVar3->first;
      local_b8 = llbuild::buildsystem::Node::getName((Node *)repairableUnownedNode._M_current);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
                (&pBVar1->mustScanAfterPaths,&local_b8);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ::~vector((vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
             *)local_28);
  return;
}

Assistant:

void deferScanningUnownedInputsUntilSubpathsAvailable() {
    auto unownedDirectoryInputNodesAndConsumingCommands = std::vector<std::pair<BuildNode*, Command*>>();
    std::copy_if(directoryInputNodesAndCommands.begin(),
                 directoryInputNodesAndCommands.end(),
                 std::back_inserter(unownedDirectoryInputNodesAndConsumingCommands),
                 [this](const std::pair<BuildNode*, Command*> directoryInputNodeAndCommand) -> bool {
      return isIncludedUnownedNode(directoryInputNodeAndCommand.first) && directoryInputNodeAndCommand.second->repairViaOwnershipAnalysis;
    });

    // For each output node and its producing command (e.g. "unowned-directory/a.txt" and "TaskA"),
    // check if there exists an unowned node (e.g. "unowned-directory/" used by "TaskC") that is a parent of the produced node.
    // Only add "a.txt" to mustScanAfterPaths of "unowned-directory/" if TaskC is marked as "repairViaOwnershipAnalysis".
    for (auto outputNodeAndCommand: outputNodesAndCommands) {
      auto repairableUnownedNode =
        std::find_if(unownedDirectoryInputNodesAndConsumingCommands.begin(),
                     unownedDirectoryInputNodesAndConsumingCommands.end(),
                     [=](std::pair<BuildNode*, Command*> unownedDirectoryAndCommand) -> bool {
          return outputNodeAndCommand.first->getName().startswith(unownedDirectoryAndCommand.first->getName()) && outputNodeAndCommand.second->repairViaOwnershipAnalysis == true;
      });
      
      if (repairableUnownedNode != unownedDirectoryInputNodesAndConsumingCommands.end()) {
        (*repairableUnownedNode).first->mustScanAfterPaths.push_back(outputNodeAndCommand.first->getName());
      }
    }
  }